

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.cpp
# Opt level: O0

bool __thiscall
basisu::pvrtc4_image::get_interpolated_colors
          (pvrtc4_image *this,uint32_t x,uint32_t y,color_rgba *pColors)

{
  bool bVar1;
  uint8_t uVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar3;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar4;
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 aVar5;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar6;
  color_rgba cVar7;
  uint uVar8;
  byte *pbVar9;
  uint8_t *puVar10;
  int iVar11;
  int x_00;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_RCX;
  anon_union_4_2_6eba8969_for_color_rgba_0 in_EDX;
  anon_union_4_2_6eba8969_for_color_rgba_0 in_ESI;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_RDI;
  uint32_t c_1;
  uint32_t m;
  uint32_t c;
  int block_y1;
  int block_y0;
  int block_x1;
  int block_x0;
  undefined1 *puVar12;
  uint32_t index;
  pvrtc4_image *in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  uint8_t uVar13;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint3 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar14;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  bool local_1;
  
  uVar14 = (uint)in_stack_ffffffffffffff98;
  if ((uint)in_ESI < (uint)*in_RDI) {
    uVar14 = CONCAT13((uint)in_EDX < (uint)in_RDI[1],in_stack_ffffffffffffff98);
  }
  if ((char)(uVar14 >> 0x18) == '\0') {
    __assert_fail("(x < m_width) && (y < m_height)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                  ,0x12e,
                  "bool basisu::pvrtc4_image::get_interpolated_colors(uint32_t, uint32_t, color_rgba *) const"
                 );
  }
  iVar11 = (int)((int)in_ESI - 2U) >> 2;
  x_00 = (int)((int)in_EDX - 2U) >> 2;
  posmod(iVar11,(int)in_RDI[8]);
  posmod(iVar11 + 1,(int)in_RDI[8]);
  posmod(x_00,(int)((color_rgba *)in_RDI)[9].field_0);
  posmod(x_00 + 1,(int)((color_rgba *)in_RDI)[9].field_0);
  vector2D<basisu::pvrtc4_block>::operator()
            ((vector2D<basisu::pvrtc4_block> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  pvrtc4_block::get_endpoint_5554
            ((pvrtc4_block *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))),
             in_stack_ffffffffffffff74);
  vector2D<basisu::pvrtc4_block>::operator()
            ((vector2D<basisu::pvrtc4_block> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  aVar3.field_1 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
       pvrtc4_block::get_endpoint_5554
                 ((pvrtc4_block *)
                  CONCAT17(in_stack_ffffffffffffff7f,
                           CONCAT16(in_stack_ffffffffffffff7e,
                                    CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))),
                  in_stack_ffffffffffffff74);
  vector2D<basisu::pvrtc4_block>::operator()
            ((vector2D<basisu::pvrtc4_block> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  aVar4.field_1 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
       pvrtc4_block::get_endpoint_5554
                 ((pvrtc4_block *)
                  CONCAT17(in_stack_ffffffffffffff7f,
                           CONCAT16(in_stack_ffffffffffffff7e,
                                    CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))),
                  in_stack_ffffffffffffff74);
  vector2D<basisu::pvrtc4_block>::operator()
            ((vector2D<basisu::pvrtc4_block> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  pvrtc4_block::get_endpoint_5554
            ((pvrtc4_block *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))),
             in_stack_ffffffffffffff74);
  aVar5 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
          interpolate((pvrtc4_image *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                      (color_rgba *)CONCAT44(in_stack_ffffffffffffff9c,uVar14),
                      (color_rgba *)&in_RDI->field_1,
                      (color_rgba *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (color_rgba *)CONCAT44(aVar3,aVar4));
  in_RCX->field_1 = aVar5;
  vector2D<basisu::pvrtc4_block>::operator()
            ((vector2D<basisu::pvrtc4_block> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  pvrtc4_block::get_endpoint_5554
            ((pvrtc4_block *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))),
             in_stack_ffffffffffffff74);
  vector2D<basisu::pvrtc4_block>::operator()
            ((vector2D<basisu::pvrtc4_block> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  pvrtc4_block::get_endpoint_5554
            ((pvrtc4_block *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))),
             in_stack_ffffffffffffff74);
  vector2D<basisu::pvrtc4_block>::operator()
            ((vector2D<basisu::pvrtc4_block> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  aVar6.field_1 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
       pvrtc4_block::get_endpoint_5554
                 ((pvrtc4_block *)
                  CONCAT17(in_stack_ffffffffffffff7f,
                           CONCAT16(in_stack_ffffffffffffff7e,
                                    CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))),
                  in_stack_ffffffffffffff74);
  vector2D<basisu::pvrtc4_block>::operator()
            ((vector2D<basisu::pvrtc4_block> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  cVar7 = pvrtc4_block::get_endpoint_5554
                    ((pvrtc4_block *)
                     CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                                      )),in_stack_ffffffffffffff74);
  puVar12 = &stack0xffffffffffffffa8;
  aVar5 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
          interpolate((pvrtc4_image *)CONCAT44(aVar6,cVar7.field_0),in_stack_ffffffffffffffa4,
                      in_stack_ffffffffffffffa0,
                      (color_rgba *)CONCAT44(in_stack_ffffffffffffff9c,uVar14),
                      (color_rgba *)&in_RDI->field_1,(color_rgba *)CONCAT44(in_EDX,in_ESI),
                      (color_rgba *)CONCAT44(aVar3,aVar4));
  in_RCX[3].field_1 = aVar5;
  bVar1 = get_block_uses_transparent_modulation
                    (in_stack_ffffffffffffff60,(uint32_t)((ulong)puVar12 >> 0x20),(uint32_t)puVar12)
  ;
  if (bVar1) {
    for (uVar14 = 0; index = (uint32_t)((ulong)puVar12 >> 0x20), uVar14 < 4; uVar14 = uVar14 + 1) {
      pbVar9 = color_rgba::operator[]((color_rgba *)in_stack_ffffffffffffff60,index);
      uVar8 = (uint)*pbVar9;
      pbVar9 = color_rgba::operator[]
                         ((color_rgba *)in_stack_ffffffffffffff60,(uint32_t)((ulong)puVar12 >> 0x20)
                         );
      uVar2 = (uint8_t)((int)(uVar8 + *pbVar9) / 2);
      uVar13 = uVar2;
      puVar10 = color_rgba::operator[]
                          ((color_rgba *)in_stack_ffffffffffffff60,
                           (uint32_t)((ulong)puVar12 >> 0x20));
      *puVar10 = uVar2;
      puVar10 = color_rgba::operator[]
                          ((color_rgba *)in_stack_ffffffffffffff60,
                           (uint32_t)((ulong)puVar12 >> 0x20));
      *puVar10 = uVar13;
    }
    puVar10 = color_rgba::operator[]((color_rgba *)in_stack_ffffffffffffff60,index);
    *puVar10 = '\0';
    local_1 = true;
  }
  else {
    for (uVar14 = 0; uVar14 < 4; uVar14 = uVar14 + 1) {
      pbVar9 = color_rgba::operator[]
                         ((color_rgba *)in_stack_ffffffffffffff60,(uint32_t)((ulong)puVar12 >> 0x20)
                         );
      iVar11 = (uint)*pbVar9 * 5;
      pbVar9 = color_rgba::operator[]
                         ((color_rgba *)in_stack_ffffffffffffff60,(uint32_t)((ulong)puVar12 >> 0x20)
                         );
      uVar13 = (uint8_t)((int)(iVar11 + (uint)*pbVar9 * 3) / 8);
      puVar10 = color_rgba::operator[]
                          ((color_rgba *)in_stack_ffffffffffffff60,
                           (uint32_t)((ulong)puVar12 >> 0x20));
      *puVar10 = uVar13;
      pbVar9 = color_rgba::operator[]
                         ((color_rgba *)in_stack_ffffffffffffff60,(uint32_t)((ulong)puVar12 >> 0x20)
                         );
      iVar11 = (uint)*pbVar9 * 3;
      pbVar9 = color_rgba::operator[]
                         ((color_rgba *)in_stack_ffffffffffffff60,(uint32_t)((ulong)puVar12 >> 0x20)
                         );
      uVar13 = (uint8_t)((int)(iVar11 + (uint)*pbVar9 * 5) / 8);
      puVar10 = color_rgba::operator[]
                          ((color_rgba *)in_stack_ffffffffffffff60,
                           (uint32_t)((ulong)puVar12 >> 0x20));
      *puVar10 = uVar13;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool pvrtc4_image::get_interpolated_colors(uint32_t x, uint32_t y, color_rgba* pColors) const
	{
		assert((x < m_width) && (y < m_height));

		int block_x0 = (static_cast<int>(x) - 2) >> 2;
		int block_x1 = block_x0 + 1;
		int block_y0 = (static_cast<int>(y) - 2) >> 2;
		int block_y1 = block_y0 + 1;
		
		block_x0 = posmod(block_x0, m_block_width);
		block_x1 = posmod(block_x1, m_block_width);
		block_y0 = posmod(block_y0, m_block_height);
		block_y1 = posmod(block_y1, m_block_height);
		
		pColors[0] = interpolate(x, y, m_blocks(block_x0, block_y0).get_endpoint_5554(0), m_blocks(block_x1, block_y0).get_endpoint_5554(0), m_blocks(block_x0, block_y1).get_endpoint_5554(0), m_blocks(block_x1, block_y1).get_endpoint_5554(0));
		pColors[3] = interpolate(x, y, m_blocks(block_x0, block_y0).get_endpoint_5554(1), m_blocks(block_x1, block_y0).get_endpoint_5554(1), m_blocks(block_x0, block_y1).get_endpoint_5554(1), m_blocks(block_x1, block_y1).get_endpoint_5554(1));

		if (get_block_uses_transparent_modulation(x >> 2, y >> 2))
		{
			for (uint32_t c = 0; c < 4; c++)
			{
				uint32_t m = (pColors[0][c] + pColors[3][c]) / 2;
				pColors[1][c] = static_cast<uint8_t>(m);
				pColors[2][c] = static_cast<uint8_t>(m);
			}
			pColors[2][3] = 0;
			return true;
		}

		for (uint32_t c = 0; c < 4; c++)
		{
			pColors[1][c] = static_cast<uint8_t>((pColors[0][c] * 5 + pColors[3][c] * 3) / 8);
			pColors[2][c] = static_cast<uint8_t>((pColors[0][c] * 3 + pColors[3][c] * 5) / 8);
		}

		return false;
	}